

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O2

void __thiscall
nodecpp::platform::internal_msg::InternalMsg::appendUint8(InternalMsg *this,uint8_t what)

{
  size_t remainingInPage;
  anon_class_8_1_8991fb9c local_30;
  anon_class_8_1_8e8574ca local_28;
  
  if ((this->currentPage).ptr == (uint8_t *)0x0) {
    if (this->totalSz == 0) {
      local_30.this = this;
      assert::
      nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::appendUint8(unsigned_char)::_lambda()_1_>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
                 ,0x213,&local_30,"currentPage.page() == nullptr");
      reserveSpaceForConvertionToTag(this);
    }
    else {
      implAddPage(this);
    }
    local_30.this = this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::appendUint8(unsigned_char)::_lambda()_2_>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0x216,&local_30,"currentPage.page() != nullptr");
  }
  local_30.this = (InternalMsg *)(0x1000 - (this->totalSz & 0xfff));
  local_28.remainingInPage = (size_t *)&local_30;
  assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::appendUint8(unsigned_char)::_lambda()_3_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
             ,0x219,&local_28,"remainingInPage != 0");
  (this->currentPage).ptr[this->totalSz & 0xfff] = what;
  this->totalSz = this->totalSz + 1;
  if (local_30.this == (InternalMsg *)0x1) {
    local_28.remainingInPage = (size_t *)this;
    assert::
    nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)2,nodecpp::platform::internal_msg::InternalMsg::appendUint8(unsigned_char)::_lambda()_4_>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/include/internal_msg.h"
               ,0x21e,(anon_class_8_1_8991fb9c *)&local_28,"offsetInCurrentPage() == 0");
    (this->currentPage).ptr = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void appendUint8( uint8_t what )
		{
			if ( currentPage.page() == nullptr )
			{
				if ( totalSz )
					implAddPage();
				else
				{
					NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() == nullptr );
					reserveSpaceForConvertionToTag();
				}
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, currentPage.page() != nullptr );
			}
			size_t remainingInPage = remainingSizeInCurrentPage();
			NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, remainingInPage != 0 );
			*(currentPage.page() + offsetInCurrentPage()) = what;
			++totalSz;
			if( 1 == remainingInPage )
			{
				NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::pedantic, offsetInCurrentPage() == 0 );
				currentPage.init();
			}
		}